

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_chroma_intra_pred_filters.c
# Opt level: O2

void ihevc_intra_pred_chroma_dc
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  byte bVar1;
  uint uVar2;
  UWORD8 *pUVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  
  uVar2 = nt << 0x1e | nt - 4U >> 2;
  if (uVar2 < 4) {
    bVar1 = (byte)*(undefined4 *)(&DAT_0017766c + (ulong)uVar2 * 4);
  }
  else {
    bVar1 = 6;
  }
  iVar6 = 0;
  iVar7 = 0;
  for (lVar4 = (long)(nt * 2); lVar4 < nt * 4; lVar4 = lVar4 + 2) {
    iVar7 = iVar7 + (uint)pu1_ref[lVar4];
    iVar6 = iVar6 + (uint)pu1_ref[lVar4 + 1];
  }
  for (uVar8 = (long)(nt * 4) | 2; (long)uVar8 < (long)(nt * 6 + 2); uVar8 = uVar8 + 2) {
    iVar7 = iVar7 + (uint)pu1_ref[uVar8];
    iVar6 = iVar6 + (uint)pu1_ref[uVar8 + 1];
  }
  uVar8 = 0;
  uVar5 = (ulong)(uint)nt;
  if (nt < 1) {
    uVar5 = 0;
  }
  pUVar3 = pu1_dst + 1;
  for (; uVar8 != uVar5; uVar8 = uVar8 + 1) {
    for (lVar4 = 0; lVar4 < nt * 2; lVar4 = lVar4 + 2) {
      pUVar3[lVar4 + -1] = (UWORD8)(iVar7 + nt >> (bVar1 & 0x1f));
      pUVar3[lVar4] = (UWORD8)(iVar6 + nt >> (bVar1 & 0x1f));
    }
    pUVar3 = pUVar3 + dst_strd;
  }
  return;
}

Assistant:

void ihevc_intra_pred_chroma_dc(UWORD8 *pu1_ref,
                                WORD32 src_strd,
                                UWORD8 *pu1_dst,
                                WORD32 dst_strd,
                                WORD32 nt,
                                WORD32 mode)
{

    WORD32 acc_dc_u, acc_dc_v;
    WORD32 dc_val_u, dc_val_v;
    WORD32 i;
    WORD32 row, col;
    WORD32 log2nt = 5;
    UNUSED(mode);
    UNUSED(src_strd);
    switch(nt)
    {
        case 32:
            log2nt = 5;
            break;
        case 16:
            log2nt = 4;
            break;
        case 8:
            log2nt = 3;
            break;
        case 4:
            log2nt = 2;
            break;
        default:
            break;
    }


    acc_dc_u = 0;
    acc_dc_v = 0;
    /* Calculate DC value for the transform block */
    for(i = (2 * nt); i < (4 * nt); i += 2)
    {
        acc_dc_u += pu1_ref[i];
        acc_dc_v += pu1_ref[i + 1];
    }
    for(i = ((4 * nt) + 2); i < ((6 * nt) + 2); i += 2)
    {
        acc_dc_u += pu1_ref[i];
        acc_dc_v += pu1_ref[i + 1];
    }


    dc_val_u = (acc_dc_u + nt) >> (log2nt + 1);
    dc_val_v = (acc_dc_v + nt) >> (log2nt + 1);


    /* Fill the remaining rows with DC value*/
    for(row = 0; row < nt; row++)
    {
        for(col = 0; col < (2 * nt); col += 2)
        {
            pu1_dst[(row * dst_strd) + col] = dc_val_u;
            pu1_dst[(row * dst_strd) + col + 1] = dc_val_v;
        }
    }

}